

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-custom.cc
# Opt level: O2

bool __thiscall DataSourceCustom::load_animation_table(DataSourceCustom *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  ResInfo *pRVar5;
  ostream *poVar6;
  long lVar7;
  ulong uVar8;
  allocator<char> local_401;
  int local_400;
  Animation animation;
  vector<Data::Animation,_std::allocator<Data::Animation>_> animations;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  ConfigFile meta;
  stringstream stream_1;
  undefined1 local_330 [376];
  stringstream stream;
  undefined1 local_1a8 [376];
  
  pRVar5 = get_info(this,AssetAnimation);
  if (pRVar5 == (ResInfo *)0x0) {
LAB_0012f70a:
    bVar1 = false;
  }
  else {
    uVar8 = 0;
    while( true ) {
      uVar2 = Data::get_resource_count(AssetAnimation);
      if (uVar2 <= uVar8) break;
      std::__cxx11::stringstream::stringstream((stringstream *)&stream);
      poVar6 = std::operator<<(local_1a8,0x30);
      *(undefined8 *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = 3;
      std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      ConfigFile::ConfigFile(&meta);
      std::operator+(&local_3b8,&pRVar5->path,"/");
      std::__cxx11::stringbuf::str();
      std::operator+(&local_398,&local_3b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &animations);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream_1,
                     &local_398,".ini");
      bVar1 = ConfigFile::load(&meta,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&stream_1);
      std::__cxx11::string::~string((string *)&stream_1);
      std::__cxx11::string::~string((string *)&local_398);
      std::__cxx11::string::~string((string *)&animations);
      std::__cxx11::string::~string((string *)&local_3b8);
      if (!bVar1) {
        ConfigFile::~ConfigFile(&meta);
        std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
        goto LAB_0012f70a;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stream_1,"general",(allocator<char> *)&animations);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_398,"count",(allocator<char> *)&animation);
      local_3b8._M_dataplus._M_p._0_4_ = 0;
      iVar3 = ConfigFile::value<int>
                        (&meta,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &stream_1,&local_398,(int *)&local_3b8);
      std::__cxx11::string::~string((string *)&local_398);
      std::__cxx11::string::~string((string *)&stream_1);
      animations.super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      animations.super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      animations.super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      for (lVar7 = 0; iVar3 != lVar7; lVar7 = lVar7 + 1) {
        std::__cxx11::stringstream::stringstream((stringstream *)&stream_1);
        poVar6 = std::operator<<(local_330,0x30);
        *(undefined8 *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = 3;
        std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b8,"sprite",&local_401)
        ;
        local_400 = 0;
        iVar4 = ConfigFile::value<int>(&meta,&local_398,&local_3b8,&local_400);
        animation.sprite = (uint8_t)iVar4;
        std::__cxx11::string::~string((string *)&local_3b8);
        std::__cxx11::string::~string((string *)&local_398);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b8,"x",&local_401);
        local_400 = 0;
        animation.x = ConfigFile::value<int>(&meta,&local_398,&local_3b8,&local_400);
        std::__cxx11::string::~string((string *)&local_3b8);
        std::__cxx11::string::~string((string *)&local_398);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b8,"y",&local_401);
        local_400 = 0;
        animation.y = ConfigFile::value<int>(&meta,&local_398,&local_3b8,&local_400);
        std::__cxx11::string::~string((string *)&local_3b8);
        std::__cxx11::string::~string((string *)&local_398);
        std::vector<Data::Animation,_std::allocator<Data::Animation>_>::push_back
                  (&animations,&animation);
        std::__cxx11::stringstream::~stringstream((stringstream *)&stream_1);
      }
      std::
      vector<std::vector<Data::Animation,_std::allocator<Data::Animation>_>,_std::allocator<std::vector<Data::Animation,_std::allocator<Data::Animation>_>_>_>
      ::push_back(&(this->super_DataSourceBase).animation_table,
                  (value_type *)
                  &animations.super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>)
      ;
      std::_Vector_base<Data::Animation,_std::allocator<Data::Animation>_>::~_Vector_base
                (&animations.super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>);
      ConfigFile::~ConfigFile(&meta);
      std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
      uVar8 = uVar8 + 1;
    }
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool
DataSourceCustom::load_animation_table() {
  ResInfo *info = get_info(Data::AssetAnimation);
  if (info == nullptr) {
    return false;
  }

  for (size_t i = 0; i < Data::get_resource_count(Data::AssetAnimation); i++) {
    std::stringstream stream;
    stream << std::setfill('0') << std::setw(3) << i;
    ConfigFile meta = ConfigFile();
    if (!meta.load(info->path + "/" + stream.str() + ".ini")) {
      return false;
    }
    size_t count = meta.value("general", "count", 0);
    std::vector<Data::Animation> animations;
    for (size_t j = 0; j < count; j++) {
      std::stringstream stream;
      stream << std::setfill('0') << std::setw(3) << j;
      Data::Animation animation;
      animation.sprite = meta.value(stream.str(), "sprite", 0);
      animation.x = meta.value(stream.str(), "x", 0);
      animation.y = meta.value(stream.str(), "y", 0);
      animations.push_back(animation);
    }
    animation_table.push_back(animations);
  }

  return true;
}